

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  undefined1 *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  cmUVProcessChainBuilder *pcVar5;
  _func_void_uv_timer_t_ptr *cb;
  uv_loop_t *puVar6;
  ostream *poVar7;
  ulong uVar8;
  rep rVar9;
  undefined4 in_stack_fffffffffffffcdc;
  byte local_2ab;
  byte local_2a9;
  undefined1 local_238 [8];
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  Status *status;
  char *error_str;
  undefined1 local_1f8 [7];
  bool result;
  char *local_1d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1d0;
  string local_1c8;
  char *local_1a8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  anon_class_24_3_3cd7b453 startRead;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errorHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  undefined1 local_158 [6];
  cmProcessOutput processOutput;
  bool errFinished;
  uv_pipe_ptr errStream;
  undefined1 local_140 [7];
  bool outFinished;
  uv_pipe_ptr outStream;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  undefined1 local_f8 [8];
  uv_timer_ptr timer;
  undefined1 local_e0 [7];
  bool timedOut;
  cmUVProcessChain chain;
  string local_d0;
  undefined1 local_a0 [8];
  cmUVProcessChainBuilder builder;
  OutputOption outputflag_local;
  char *dir_local;
  int *retVal_local;
  string *captureStdErr_local;
  string *captureStdOut_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  cmDuration timeout_local;
  
  builder.Loop._4_4_ = outputflag;
  command_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)timeout.__r;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_a0);
  pcVar5 = cmUVProcessChainBuilder::SetExternalStream
                     ((cmUVProcessChainBuilder *)local_a0,Stream_INPUT,_stdin);
  cmUVProcessChainBuilder::AddCommand(pcVar5,command);
  if (dir != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,dir,
               (allocator<char> *)
               ((long)&chain.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
    cmUVProcessChainBuilder::SetWorkingDirectory((cmUVProcessChainBuilder *)local_a0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&chain.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
  }
  if (builder.Loop._4_4_ == OUTPUT_PASSTHROUGH) {
    captureStdErr_local = (string *)0x0;
    retVal_local = (int *)0x0;
    pcVar5 = cmUVProcessChainBuilder::SetExternalStream
                       ((cmUVProcessChainBuilder *)local_a0,Stream_OUTPUT,_stdout);
    cmUVProcessChainBuilder::SetExternalStream(pcVar5,Stream_ERROR,_stderr);
  }
  else {
    captureStdErr_local = captureStdOut;
    if ((builder.Loop._4_4_ == OUTPUT_MERGE) ||
       ((captureStdErr != (string *)0x0 && (captureStdErr == captureStdOut)))) {
      cmUVProcessChainBuilder::SetMergedBuiltinStreams((cmUVProcessChainBuilder *)local_a0);
      retVal_local = (int *)0x0;
    }
    else {
      pcVar5 = cmUVProcessChainBuilder::SetBuiltinStream
                         ((cmUVProcessChainBuilder *)local_a0,Stream_OUTPUT);
      cmUVProcessChainBuilder::SetBuiltinStream(pcVar5,Stream_ERROR);
      retVal_local = (int *)captureStdErr;
    }
  }
  if (retVal_local == (int *)0x0 || (string *)retVal_local != captureStdErr_local) {
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_e0);
    timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
    super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
    cm::uv_timer_ptr::uv_timer_ptr((uv_timer_ptr *)local_f8);
    rVar9 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                      ((duration<double,_std::ratio<1L,_1L>_> *)&command_local);
    if ((rVar9 != 0.0) || (NAN(rVar9))) {
      puVar6 = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_e0);
      cm::uv_timer_ptr::init((uv_timer_ptr *)local_f8,(EVP_PKEY_CTX *)puVar6);
      cb = RunSingleCommand(std::vector_const&,std::__cxx11::string*,std::__cxx11::string*,int*,char_const*,cmSystemTools::OutputOption,std::chrono::duration,cmProcessOutput::Encoding)
           ::$_0::operator_cast_to_function_pointer
                     ((__0 *)&tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x17);
      rVar9 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                        ((duration<double,_std::ratio<1L,_1L>_> *)&command_local);
      uVar8 = (ulong)(rVar9 * 1000.0);
      cm::uv_timer_ptr::start
                ((uv_timer_ptr *)local_f8,cb,
                 uVar8 | (long)(rVar9 * 1000.0 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f,0);
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)
               &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)
               &outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_140);
    cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_158);
    outputHandle._M_t.
    super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
    super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
    super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._7_1_ = 1;
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)
               ((long)&outputHandle._M_t.
                       super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                       .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 6),
               encoding,0x400);
    std::unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>>::
    unique_ptr<std::default_delete<cmUVStreamReadHandle>,void>
              ((unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>> *)
               &errorHandle);
    std::unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>>::
    unique_ptr<std::default_delete<cmUVStreamReadHandle>,void>
              ((unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>> *)
               &startRead.chain);
    if ((builder.Loop._4_4_ != OUTPUT_PASSTHROUGH) &&
       (((captureStdErr_local != (string *)0x0 || (retVal_local != (int *)0x0)) ||
        (builder.Loop._4_4_ != OUTPUT_NONE)))) {
      local_188 = (undefined1  [8])((long)&builder.Loop + 4);
      startRead.outputflag =
           (OutputOption *)
           ((long)&outputHandle._M_t.
                   super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                   .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 6);
      startRead.processOutput = (cmProcessOutput *)local_e0;
      uVar2 = cmUVProcessChain::OutputStream((cmUVProcessChain *)startRead.processOutput);
      RunSingleCommand::anon_class_24_3_3cd7b453::operator()
                ((anon_class_24_3_3cd7b453 *)(local_198 + 8),(uv_pipe_ptr *)local_188,(int)local_140
                 ,(string *)(ulong)uVar2,(vector<char,_std::allocator<char>_> *)captureStdErr_local,
                 (int)&tempStdErr + 0x10,
                 (_func_void_string_ptr *)CONCAT44(in_stack_fffffffffffffcdc,1),(bool *)Stdout);
      std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::operator=
                (&errorHandle,
                 (unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                 (local_198 + 8));
      std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
                ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                 (local_198 + 8));
      iVar3 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_e0);
      iVar4 = cmUVProcessChain::ErrorStream((cmUVProcessChain *)local_e0);
      if (iVar3 != iVar4) {
        uVar2 = cmUVProcessChain::ErrorStream((cmUVProcessChain *)local_e0);
        RunSingleCommand::anon_class_24_3_3cd7b453::operator()
                  ((anon_class_24_3_3cd7b453 *)local_198,(uv_pipe_ptr *)local_188,(int)local_158,
                   (string *)(ulong)uVar2,(vector<char,_std::allocator<char>_> *)retVal_local,
                   (int)&outStream + 8,
                   (_func_void_string_ptr *)CONCAT44(in_stack_fffffffffffffcdc,2),(bool *)Stderr);
        std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::operator=
                  ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                   &startRead.chain,
                   (unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                   local_198);
        std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::
        ~unique_ptr((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                    local_198);
      }
    }
    while( true ) {
      local_2a9 = 0;
      if ((timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
           super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
          == 0) {
        bVar1 = cmUVProcessChain::Finished((cmUVProcessChain *)local_e0);
        local_2ab = 0;
        if (bVar1) {
          local_2ab = outputHandle._M_t.
                      super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                      .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._7_1_;
        }
        local_2a9 = local_2ab ^ 0xff;
      }
      if ((local_2a9 & 1) == 0) break;
      puVar6 = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_e0);
      uv_run(puVar6,UV_RUN_ONCE);
    }
    if (captureStdErr_local != (string *)0x0) {
      this = &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      local_1a0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)this);
      local_1a8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                    ((vector<char,_std::allocator<char>_> *)this);
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                ((string *)captureStdErr_local,local_1a0,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_1a8);
      std::__cxx11::string::string((string *)&local_1c8,(string *)captureStdErr_local);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)
                 ((long)&outputHandle._M_t.
                         super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                         .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 6),
                 &local_1c8,captureStdErr_local,0);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    if (retVal_local != (int *)0x0) {
      this_00 = &outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                 handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_1d0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)this_00);
      local_1d8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                    ((vector<char,_std::allocator<char>_> *)this_00);
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                ((string *)retVal_local,local_1d0,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_1d8);
      std::__cxx11::string::string((string *)local_1f8,(string *)retVal_local);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)
                 ((long)&outputHandle._M_t.
                         super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                         .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 6),
                 (string *)local_1f8,(string *)retVal_local,0);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    error_str._7_1_ = true;
    if ((timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
         super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1) ==
        0) {
      exception.second.field_2._8_8_ = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_e0,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,(Status *)exception.second.field_2._8_8_);
      if (local_238._0_4_ == None) {
        if (retVal == (int *)0x0) {
          error_str._7_1_ = *(long *)(exception.second.field_2._8_8_ + 8) == 0;
        }
        else {
          *retVal = (int)*(undefined8 *)(exception.second.field_2._8_8_ + 8);
        }
      }
      else {
        if (builder.Loop._4_4_ != OUTPUT_NONE) {
          poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&exception);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        if (retVal_local == (int *)0x0) {
          if (captureStdErr_local != (string *)0x0) {
            std::__cxx11::string::append((string *)captureStdErr_local);
          }
        }
        else {
          std::__cxx11::string::append((string *)retVal_local);
        }
        error_str._7_1_ = false;
      }
      std::
      pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_238);
    }
    else {
      if (builder.Loop._4_4_ != OUTPUT_NONE) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Process terminated due to timeout\n");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      if (retVal_local != (int *)0x0) {
        strlen("Process terminated due to timeout\n");
        std::__cxx11::string::append((char *)retVal_local,0x479ae8);
      }
      error_str._7_1_ = false;
    }
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
               &startRead.chain);
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              (&errorHandle);
    cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_158);
    cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_140);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               &outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    cm::uv_timer_ptr::~uv_timer_ptr((uv_timer_ptr *)local_f8);
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_e0);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_a0);
    return error_str._7_1_;
  }
  __assert_fail("!captureStdErr || captureStdErr != captureStdOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx"
                ,0x254,
                "static bool cmSystemTools::RunSingleCommand(const std::vector<std::string> &, std::string *, std::string *, int *, const char *, OutputOption, cmDuration, Encoding)"
               );
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  cmUVProcessChainBuilder builder;
  builder.SetExternalStream(cmUVProcessChainBuilder::Stream_INPUT, stdin)
    .AddCommand(command);
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    captureStdOut = nullptr;
    captureStdErr = nullptr;
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    builder.SetMergedBuiltinStreams();
    captureStdErr = nullptr;
  } else {
    builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
      .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  auto chain = builder.Start();
  bool timedOut = false;
  cm::uv_timer_ptr timer;
  if (timeout.count()) {
    timer.init(chain.GetLoop(), &timedOut);
    timer.start(
      [](uv_timer_t* t) {
        auto* timedOutPtr = static_cast<bool*>(t->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);
  }

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  cm::uv_pipe_ptr outStream;
  bool outFinished = true;
  cm::uv_pipe_ptr errStream;
  bool errFinished = true;
  cmProcessOutput processOutput(encoding);
  std::unique_ptr<cmUVStreamReadHandle> outputHandle;
  std::unique_ptr<cmUVStreamReadHandle> errorHandle;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    auto startRead =
      [&outputflag, &processOutput,
       &chain](cm::uv_pipe_ptr& pipe, int stream, std::string* captureStd,
               std::vector<char>& tempStd, int id,
               void (*outputFunc)(const std::string&),
               bool& finished) -> std::unique_ptr<cmUVStreamReadHandle> {
      if (stream < 0) {
        return nullptr;
      }

      pipe.init(chain.GetLoop(), 0);
      uv_pipe_open(pipe, stream);

      finished = false;
      return cmUVStreamRead(
        pipe,
        [outputflag, &processOutput, captureStd, &tempStd, id,
         outputFunc](std::vector<char> data) {
          // Translate NULL characters in the output into valid text.
          for (auto& c : data) {
            if (c == '\0') {
              c = ' ';
            }
          }

          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(data.data(), data.size(), strdata, id);
            outputFunc(strdata);
          }
          if (captureStd) {
            cm::append(tempStd, data.data(), data.data() + data.size());
          }
        },
        [&finished, outputflag, &processOutput, id, outputFunc]() {
          finished = true;
          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(std::string(), strdata, id);
            if (!strdata.empty()) {
              outputFunc(strdata);
            }
          }
        });
    };

    outputHandle =
      startRead(outStream, chain.OutputStream(), captureStdOut, tempStdOut, 1,
                cmSystemTools::Stdout, outFinished);
    if (chain.OutputStream() != chain.ErrorStream()) {
      errorHandle =
        startRead(errStream, chain.ErrorStream(), captureStdErr, tempStdErr, 2,
                  cmSystemTools::Stderr, errFinished);
    }
  }

  while (!timedOut && !(chain.Finished() && outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (timedOut) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();

    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (retVal) {
          *retVal = static_cast<int>(status.ExitStatus);
        } else {
          if (status.ExitStatus != 0) {
            result = false;
          }
        }
        break;
      default: {
        if (outputflag != OUTPUT_NONE) {
          std::cerr << exception.second << std::endl;
        }
        if (captureStdErr) {
          captureStdErr->append(exception.second);
        } else if (captureStdOut) {
          captureStdOut->append(exception.second);
        }
        result = false;
      } break;
    }
  }

  return result;
}